

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

void u_versionFromUString_63(uint8_t *versionArray,UChar *versionString)

{
  int local_3c;
  char local_38 [4];
  int32_t len;
  char versionChars [21];
  UChar *versionString_local;
  uint8_t *versionArray_local;
  
  if ((versionArray != (uint8_t *)0x0) && (versionString != (UChar *)0x0)) {
    local_3c = u_strlen_63(versionString);
    if (0x14 < local_3c) {
      local_3c = 0x14;
    }
    u_UCharsToChars_63(versionString,local_38,local_3c);
    local_38[local_3c] = '\0';
    u_versionFromString_63(versionArray,local_38);
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_versionFromUString(UVersionInfo versionArray, const UChar *versionString) {
    if(versionArray!=NULL && versionString!=NULL) {
        char versionChars[U_MAX_VERSION_STRING_LENGTH+1];
        int32_t len = u_strlen(versionString);
        if(len>U_MAX_VERSION_STRING_LENGTH) {
            len = U_MAX_VERSION_STRING_LENGTH;
        }
        u_UCharsToChars(versionString, versionChars, len);
        versionChars[len]=0;
        u_versionFromString(versionArray, versionChars);
    }
}